

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryTexture(AssbinImporter *this,IOStream *stream,aiTexture *tex)

{
  uint uVar1;
  aiTexel *paVar2;
  runtime_error *this_00;
  ulong uVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 != 0x1236) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Magic chunk identifiers are wrong!","");
    std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  uVar1 = Read<unsigned_int>(stream);
  tex->mWidth = uVar1;
  uVar1 = Read<unsigned_int>(stream);
  tex->mHeight = uVar1;
  (*stream->_vptr_IOStream[2])(stream,tex->achFormatHint,1,4);
  if (this->shortened != false) {
    return;
  }
  uVar3 = (ulong)tex->mWidth;
  if (tex->mHeight == 0) {
    paVar2 = (aiTexel *)operator_new__(uVar3 * 4);
    tex->pcData = paVar2;
  }
  else {
    uVar1 = tex->mWidth * tex->mHeight;
    paVar2 = (aiTexel *)operator_new__((ulong)uVar1 * 4);
    tex->pcData = paVar2;
    uVar3 = (ulong)(uVar1 * 4);
  }
  (*stream->_vptr_IOStream[2])(stream,paVar2,1,uVar3,stream->_vptr_IOStream[2]);
  return;
}

Assistant:

void AssbinImporter::ReadBinaryTexture(IOStream * stream, aiTexture* tex) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AITEXTURE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    tex->mWidth = Read<unsigned int>(stream);
    tex->mHeight = Read<unsigned int>(stream);
    stream->Read( tex->achFormatHint, sizeof(char), 4 );

    if(!shortened) {
        if (!tex->mHeight) {
            tex->pcData = new aiTexel[ tex->mWidth ];
            stream->Read(tex->pcData,1,tex->mWidth);
        } else {
            tex->pcData = new aiTexel[ tex->mWidth*tex->mHeight ];
            stream->Read(tex->pcData,1,tex->mWidth*tex->mHeight*4);
        }
    }
}